

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool process_args(int argc,char **argv,conf_t *config)

{
  pointer *pppcVar1;
  iterator __position;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char **__args;
  char *pcVar7;
  
  bVar3 = 1 < argc;
  if (1 < argc) {
    pcVar7 = argv[1];
    iVar4 = strcmp(pcVar7,"-h");
    if (iVar4 != 0) {
      __args = argv + 1;
      iVar4 = 1;
      do {
        iVar5 = strcmp(pcVar7,"-v");
        if (iVar5 == 0) {
          config->verbose = true;
        }
        else {
          iVar5 = strcmp(pcVar7,"-s");
          if (iVar5 == 0) {
            config->simulate = true;
          }
          else {
            iVar5 = strcmp(pcVar7,"-o");
            if (iVar5 == 0) {
              if (argc + -1 <= iVar4) break;
              lVar6 = (long)iVar4;
              iVar4 = iVar4 + 1;
              pcVar7 = argv[lVar6 + 1];
              pcVar2 = (char *)(config->output_path)._M_string_length;
              strlen(pcVar7);
              std::__cxx11::string::_M_replace((ulong)&config->output_path,0,pcVar2,(ulong)pcVar7);
            }
            else {
              __position._M_current =
                   (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                          ((vector<char*,std::allocator<char*>> *)&config->files,__position,__args);
              }
              else {
                *__position._M_current = pcVar7;
                pppcVar1 = &(config->files).super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppcVar1 = *pppcVar1 + 1;
              }
            }
          }
        }
        iVar4 = iVar4 + 1;
        bVar3 = iVar4 < argc;
        if (argc <= iVar4) goto LAB_00102c60;
        __args = argv + iVar4;
        pcVar7 = *__args;
        iVar5 = strcmp(pcVar7,"-h");
      } while (iVar5 != 0);
    }
    if (bVar3) {
      return false;
    }
  }
LAB_00102c60:
  return (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

bool process_args(int argc, char **argv, conf_t &config)
{
	for (int i = 1; i < argc; ++i) {
		if (!strcmp(argv[i], "-h")) {
			return false;
		} else if (!strcmp(argv[i], "-v")) {
			config.verbose = true;
		} else if (!strcmp(argv[i], "-s")) {
			config.simulate = true;
		} else if (!strcmp(argv[i], "-o")) {
			if (i < argc - 1) {
				config.output_path = argv[++i];
			} else {
				return false;
			}
		} else {
			config.files.push_back(argv[i]);
		}
	}

	if (config.files.size() > 0) {
		return true;
	} else {
		return false;
	}
}